

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O0

bool __thiscall
iutest::detail::TypedTestSuitePState::VerifyTestNames
          (TypedTestSuitePState *this,char *file,int line,char *test_names)

{
  bool bVar1;
  reference ppcVar2;
  iu_stringstream *piVar3;
  ostream *poVar4;
  int iVar5;
  string local_3c8;
  IUTestLog local_3a8;
  string local_208;
  IUTestLog local_1e8;
  size_t local_58;
  size_t len;
  char *p;
  char *test_name;
  iterator end;
  iterator it;
  bool ret;
  char *test_names_local;
  int line_local;
  char *file_local;
  TypedTestSuitePState *this_local;
  
  this->m_names = test_names;
  it._M_node._7_1_ = true;
  end = std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::begin
                  (&this->m_list);
  test_name = (char *)std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>
                      ::end(&this->m_list);
  do {
    bVar1 = std::operator!=(&end,(_Self *)&test_name);
    if (!bVar1) {
      return it._M_node._7_1_;
    }
    ppcVar2 = std::_Rb_tree_const_iterator<const_char_*>::operator*(&end);
    p = *ppcVar2;
    len = (size_t)strstr(test_names,p);
    if ((char *)len == (char *)0x0) {
LAB_003fadc0:
      iVar5 = 0x1c8;
      IUTestLog::IUTestLog
                (&local_3a8,LOG_WARNING,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/../include/gtest/../iutest_typed_tests.hpp"
                 ,0x1c8);
      piVar3 = IUTestLog::GetStream_abi_cxx11_(&local_3a8);
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (&local_3c8,(detail *)file,(char *)(ulong)(uint)line,iVar5);
      poVar4 = std::operator<<((ostream *)&piVar3->field_0x10,(string *)&local_3c8);
      poVar4 = std::operator<<(poVar4,": Test \"");
      poVar4 = std::operator<<(poVar4,p);
      poVar4 = std::operator<<(poVar4,"\" has not been registered.\n");
      poVar4 = std::operator<<(poVar4,"    TestNames: ");
      std::operator<<(poVar4,test_names);
      std::__cxx11::string::~string((string *)&local_3c8);
      IUTestLog::~IUTestLog(&local_3a8);
      it._M_node._7_1_ = false;
    }
    else {
      local_58 = strlen(p);
      if (((*(char *)(len + local_58) != '\0') && (*(char *)(len + local_58) != ',')) &&
         (bVar1 = IsSpace(*(char *)(len + local_58)), !bVar1)) {
        iVar5 = 0x1c4;
        IUTestLog::IUTestLog
                  (&local_1e8,LOG_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/../include/gtest/../iutest_typed_tests.hpp"
                   ,0x1c4);
        piVar3 = IUTestLog::GetStream_abi_cxx11_(&local_1e8);
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  (&local_208,(detail *)file,(char *)(ulong)(uint)line,iVar5);
        poVar4 = std::operator<<((ostream *)&piVar3->field_0x10,(string *)&local_208);
        poVar4 = std::operator<<(poVar4,": Test \"");
        poVar4 = std::operator<<(poVar4,p);
        poVar4 = std::operator<<(poVar4,"\" is find in \"");
        poVar4 = std::operator<<(poVar4,test_names);
        poVar4 = std::operator<<(poVar4,"\". expected whitespace or comma : ");
        poVar4 = std::operator<<(poVar4,*(char *)(len + local_58));
        poVar4 = std::operator<<(poVar4,"(");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)*(char *)(len + local_58));
        std::operator<<(poVar4,")\n");
        std::__cxx11::string::~string((string *)&local_208);
        IUTestLog::~IUTestLog(&local_1e8);
        goto LAB_003fadc0;
      }
    }
    std::_Rb_tree_const_iterator<const_char_*>::operator++(&end);
  } while( true );
}

Assistant:

bool VerifyTestNames(const char* file, int line, const char* test_names)
    {
        m_names = test_names;
        IUTEST_PRAGMA_CONSTEXPR_CALLED_AT_RUNTIME_WARN_DISABLE_BEGIN()
#if IUTEST_TYPED_TEST_P_STRICT
        bool ret = true;
        for( nameset_t::iterator it=m_list.begin(), end=m_list.end(); it != end; ++it )
        {
            const char* test_name = *it;
            const char* p = strstr(test_names, test_name);
            if( p != NULL )
            {
                const size_t len = strlen(test_name);
                if( p[len] == '\0' || p[len] == ',' || detail::IsSpace(p[len]) )
                {
                    continue;
                }
                IUTEST_LOG_(FATAL) << detail::FormatCompilerIndependentFileLocation(file, line)
                << ": Test \"" << test_name << "\" is find in \"" << test_names
                    << "\". expected whitespace or comma : " << p[len] << "(" << static_cast<int>(p[len]) <<  ")\n";
            }
            IUTEST_LOG_(WARNING) << detail::FormatCompilerIndependentFileLocation(file, line)
                << ": Test \"" << test_name << "\" has not been registered.\n" << "    TestNames: " << test_names;
            ret = false;
        }
        return ret;
#else
        IUTEST_UNUSED_VAR(file);
        IUTEST_UNUSED_VAR(line);
        return true;
#endif
        IUTEST_PRAGMA_CONSTEXPR_CALLED_AT_RUNTIME_WARN_DISABLE_END()
    }